

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_fe4d0d::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  ulong uVar1;
  undefined8 uVar2;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmMakefile *pcVar7;
  cmList *pcVar8;
  out_of_range *e;
  string_view local_148;
  int *local_138;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_130;
  undefined1 local_128 [8];
  cmList values;
  int local_ec;
  ulong uStack_e8;
  int index;
  size_t cc;
  vector<int,_std::allocator<int>_> indexes;
  string local_c0;
  undefined4 local_9c;
  string_view local_98;
  undefined1 local_88 [8];
  optional<cmList> list;
  string *variableName;
  string *listName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar3 = local_20;
  if (sVar5 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command GET requires at least three arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    list.super__Optional_base<cmList,_false,_false>._M_payload.
    super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>._24_8_
         = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)status_local);
    pcVar7 = cmExecutionStatus::GetMakefile(local_20);
    GetList((optional<cmList> *)local_88,pvVar6,pcVar7);
    bVar4 = std::optional::operator_cast_to_bool((optional *)local_88);
    if (bVar4) {
      pcVar8 = std::optional<cmList>::operator->((optional<cmList> *)local_88);
      bVar4 = cmList::empty(pcVar8);
      pcVar3 = local_20;
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"GET given empty list",
                   (allocator<char> *)
                   ((long)&indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        cmExecutionStatus::SetError(pcVar3,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        args_local._7_1_ = 0;
        local_9c = 1;
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&cc);
        uStack_e8 = 2;
        while( true ) {
          uVar1 = uStack_e8;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          if (sVar5 - 1 <= uVar1) break;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,uStack_e8);
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          bVar4 = GetIndexArg(pvVar6,&local_ec,pcVar7);
          pcVar3 = local_20;
          if (!bVar4) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,uStack_e8);
            cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                      ((string *)
                       &values.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [8])0x12386d6,
                       pvVar6,(char (*) [22])0x127d65e);
            cmExecutionStatus::SetError
                      (pcVar3,(string *)
                              &values.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &values.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            args_local._7_1_ = 0;
            local_9c = 1;
            goto LAB_00833110;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&cc,&local_ec);
          uStack_e8 = uStack_e8 + 1;
        }
        pcVar8 = std::optional<cmList>::operator->((optional<cmList> *)local_88);
        local_130._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&cc);
        local_138 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)&cc);
        cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((cmList *)local_128,pcVar8,local_130,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_138);
        pcVar7 = cmExecutionStatus::GetMakefile(local_20);
        uVar2 = list.super__Optional_base<cmList,_false,_false>._M_payload.
                super__Optional_payload<cmList,_true,_false,_false>.
                super__Optional_payload_base<cmList>._24_8_;
        cmList::to_string_abi_cxx11_((string *)&e,(cmList *)local_128);
        local_148 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
        cmMakefile::AddDefinition(pcVar7,(string *)uVar2,local_148);
        std::__cxx11::string::~string((string *)&e);
        args_local._7_1_ = 1;
        local_9c = 1;
        cmList::~cmList((cmList *)local_128);
LAB_00833110:
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&cc);
      }
    }
    else {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      uVar2 = list.super__Optional_base<cmList,_false,_false>._M_payload.
              super__Optional_payload<cmList,_true,_false,_false>.
              super__Optional_payload_base<cmList>._24_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"NOTFOUND")
      ;
      cmMakefile::AddDefinition(pcVar7,(string *)uVar2,local_98);
      args_local._7_1_ = 1;
      local_9c = 1;
    }
    std::optional<cmList>::~optional((optional<cmList> *)local_88);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<cm::string_view,
                  std::function<cmCMakePath(const cmCMakePath&, bool)>> const
    actions{ { "ROOT_NAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootName();
               } },
             { "ROOT_DIRECTORY"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootDirectory();
               } },
             { "ROOT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootPath();
               } },
             { "FILENAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetFileName();
               } },
             { "EXTENSION"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetExtension();
                 }
                 return path.GetWideExtension();
               } },
             { "STEM"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetStem();
                 }
                 return path.GetNarrowStem();
               } },
             { "RELATIVE_PART"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRelativePath();
               } },
             { "PARENT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetParentPath();
               } } };

  if (args.size() < 4) {
    status.SetError("GET must be called with at least three arguments.");
    return false;
  }

  const auto& action = args[2];

  if (actions.find(action) == actions.end()) {
    status.SetError(
      cmStrCat("GET called with an unknown action: ", action, "."));
    return false;
  }

  struct Arguments
  {
    bool LastOnly = false;
  };

  CMakePathArgumentParser<Arguments> parser;
  if ((action == "EXTENSION"_s || action == "STEM"_s)) {
    parser.Bind("LAST_ONLY"_s, &Arguments::LastOnly);
  }

  Arguments const arguments = parser.Parse<3>(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("GET called with unexpected arguments.");
    return false;
  }
  if (parser.GetInputs().front().empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  std::string path;
  if (!getInputPath(args[1], status, path)) {
    return false;
  }

  auto result = actions.at(action)(path, arguments.LastOnly);

  status.GetMakefile().AddDefinition(parser.GetInputs().front(),
                                     result.String());

  return true;
}